

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrayops.c
# Opt level: O0

LispPTR N_OP_misc4(LispPTR data,LispPTR base,LispPTR typenumber,LispPTR inx,int alpha)

{
  LispPTR LVar1;
  ushort uVar2;
  LispPTR *pLVar3;
  byte *pbVar4;
  DLword *pDVar5;
  uint local_3c;
  uint uStack_38;
  DLword new_6;
  int new_5;
  int new_4;
  int new_3;
  int new_2;
  DLword new_1;
  DLword new;
  int type;
  int index;
  int alpha_local;
  LispPTR inx_local;
  LispPTR typenumber_local;
  LispPTR base_local;
  LispPTR data_local;
  
  if (alpha != 7) {
    MachineState.tosvalue = inx;
    MachineState.errorexit = 1;
    return 0xffffffff;
  }
  if ((inx & 0xfff0000) == 0xe0000) {
    _new_1 = inx & 0xffff;
  }
  else {
    if ((*(ushort *)((ulong)(MDStypetbl + (inx >> 9)) ^ 2) & 0x7ff) != 2) {
      MachineState.tosvalue = inx;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
    pLVar3 = NativeAligned4FromLAddr(inx);
    _new_1 = *pLVar3;
    if ((_new_1 & 0x80000000) != 0) {
      MachineState.tosvalue = inx;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
  }
  if ((typenumber & 0xfff0000) == 0xe0000) {
    new_2 = typenumber & 0xffff;
  }
  else {
    if ((*(ushort *)((ulong)(MDStypetbl + (typenumber >> 9)) ^ 2) & 0x7ff) != 2) {
      MachineState.tosvalue = inx;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
    pLVar3 = NativeAligned4FromLAddr(typenumber);
    new_2 = *pLVar3;
    if ((new_2 & 0x80000000U) != 0) {
      MachineState.tosvalue = inx;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
  }
  pDVar5 = MDStypetbl;
  uVar2 = (ushort)data;
  base_local = data;
  switch(new_2) {
  case 0:
    if ((data & 0xfff0000) == 0xe0000) {
      new_5 = data & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(MDStypetbl + (data >> 9)) ^ 2) & 0x7ff) != 2) {
        MachineState.tosvalue = inx;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      pLVar3 = NativeAligned4FromLAddr(data);
      new_5 = *pLVar3;
      if ((new_5 & 0x80000000U) != 0) {
        MachineState.tosvalue = inx;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
    }
    if (new_5 < 2) {
      if (new_5 == 0) {
        pDVar5 = NativeAligned2FromLAddr(base);
        pbVar4 = (byte *)((long)pDVar5 + (long)((int)_new_1 >> 3) ^ 3);
        *pbVar4 = *pbVar4 & -(char)(1 << (7 - ((byte)_new_1 & 7) & 0x1f)) - 1U;
      }
      else {
        pDVar5 = NativeAligned2FromLAddr(base);
        pbVar4 = (byte *)((long)pDVar5 + (long)((int)_new_1 >> 3) ^ 3);
        *pbVar4 = *pbVar4 | (byte)(1 << (7 - ((byte)_new_1 & 7) & 0x1f));
      }
    }
    else {
      MachineState.errorexit = 1;
      base_local = 0xffffffff;
      MachineState.tosvalue = inx;
    }
    break;
  default:
    MachineState.errorexit = 1;
    base_local = 0xffffffff;
    MachineState.tosvalue = inx;
    break;
  case 3:
    if ((data & 0xfff0000) == 0xe0000) {
      uStack_38 = data & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(MDStypetbl + (data >> 9)) ^ 2) & 0x7ff) != 2) {
        MachineState.tosvalue = inx;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      pLVar3 = NativeAligned4FromLAddr(data);
      uStack_38 = *pLVar3;
      if ((uStack_38 & 0x80000000) != 0) {
        MachineState.tosvalue = inx;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
    }
    if ((int)uStack_38 < 0x100) {
      pDVar5 = NativeAligned2FromLAddr(base);
      *(char *)((long)pDVar5 + (long)(int)_new_1 ^ 3) = (char)uStack_38;
    }
    else {
      MachineState.errorexit = 1;
      base_local = 0xffffffff;
      MachineState.tosvalue = inx;
    }
    break;
  case 4:
    if ((data & 0xfff0000) == 0xe0000) {
      local_3c = data & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(MDStypetbl + (data >> 9)) ^ 2) & 0x7ff) != 2) {
        MachineState.tosvalue = inx;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      pLVar3 = NativeAligned4FromLAddr(data);
      local_3c = *pLVar3;
      if ((local_3c & 0x80000000) != 0) {
        MachineState.tosvalue = inx;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
    }
    if ((int)local_3c < 0x10000) {
      pDVar5 = NativeAligned2FromLAddr(base);
      *(short *)((ulong)(pDVar5 + (int)_new_1) ^ 2) = (short)local_3c;
    }
    else {
      MachineState.errorexit = 1;
      base_local = 0xffffffff;
      MachineState.tosvalue = inx;
    }
    break;
  case 0x14:
    if ((((data & 0xfff0000) == 0xe0000) && ((data & 0x8000) == 0)) ||
       (((data & 0xfff0000) == 0xf0000 && ((data & 0x8000) != 0)))) {
      pDVar5 = NativeAligned2FromLAddr(base);
      *(ushort *)((ulong)(pDVar5 + (int)_new_1) ^ 2) = uVar2;
    }
    else {
      MachineState.errorexit = 1;
      base_local = 0xffffffff;
      MachineState.tosvalue = inx;
    }
    break;
  case 0x16:
    if ((data & 0xfff0000) == 0xe0000) {
      new_4 = data & 0xffff;
    }
    else if ((data & 0xfff0000) == 0xf0000) {
      new_4 = data | 0xffff0000;
    }
    else {
      if ((*(ushort *)((ulong)(MDStypetbl + (data >> 9)) ^ 2) & 0x7ff) != 2) {
        MachineState.tosvalue = inx;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      pLVar3 = NativeAligned4FromLAddr(data);
      new_4 = *pLVar3;
    }
    pLVar3 = NativeAligned4FromLAddr(base);
    pLVar3[(int)_new_1] = new_4;
    break;
  case 0x26:
    pLVar3 = NativeAligned4FromLAddr(base);
    if (((*(ushort *)((ulong)(pDVar5 + (pLVar3[(int)_new_1] >> 9)) ^ 2) & 0x8000) == 0) &&
       (*GcDisabled_word != 0x4c)) {
      if (*Reclaim_cnt_word == 0) {
        pLVar3 = NativeAligned4FromLAddr(base);
        rec_htfind(pLVar3[(int)_new_1],1);
      }
      else {
        pLVar3 = NativeAligned4FromLAddr(base);
        htfind(pLVar3[(int)_new_1],1);
      }
    }
    if (((*(ushort *)((ulong)(MDStypetbl + (data >> 9)) ^ 2) & 0x8000) == 0) &&
       (*GcDisabled_word != 0x4c)) {
      if (*Reclaim_cnt_word == 0) {
        rec_htfind(data,0);
      }
      else {
        htfind(data,0);
      }
    }
    pLVar3 = NativeAligned4FromLAddr(base);
    pLVar3[(int)_new_1] = data;
    break;
  case 0x36:
    if ((*(ushort *)((ulong)(MDStypetbl + (data >> 9)) ^ 2) & 0x7ff) == 3) {
      pLVar3 = NativeAligned4FromLAddr(data);
      LVar1 = *pLVar3;
      pLVar3 = NativeAligned4FromLAddr(base);
      pLVar3[(int)_new_1] = LVar1;
    }
    else {
      MachineState.errorexit = 1;
      base_local = 0xffffffff;
      MachineState.tosvalue = inx;
    }
    break;
  case 0x43:
    if ((data & 0xfff0000) == 0x70000) {
      if (uVar2 < 0x100) {
        pDVar5 = NativeAligned2FromLAddr(base);
        *(char *)((long)pDVar5 + (long)(int)_new_1 ^ 3) = (char)data;
      }
      else {
        MachineState.errorexit = 1;
        base_local = 0xffffffff;
        MachineState.tosvalue = inx;
      }
    }
    else {
      MachineState.errorexit = 1;
      base_local = 0xffffffff;
      MachineState.tosvalue = inx;
    }
    break;
  case 0x44:
    if ((data & 0xfff0000) == 0x70000) {
      pDVar5 = NativeAligned2FromLAddr(base);
      *(ushort *)((ulong)(pDVar5 + (int)_new_1) ^ 2) = uVar2;
    }
    else {
      MachineState.errorexit = 1;
      base_local = 0xffffffff;
      MachineState.tosvalue = inx;
    }
    break;
  case 0x56:
    pLVar3 = NativeAligned4FromLAddr(base);
    pLVar3[(int)_new_1] = data;
  }
  return base_local;
}

Assistant:

LispPTR N_OP_misc4(LispPTR data, LispPTR base, LispPTR typenumber,
                   LispPTR inx, int alpha) {
  int index, type;

  if (alpha != 7) ERROR_EXIT(inx);

  /*  test and setup index  */
  N_GetPos(inx, index, inx);

  /*  test and setup typenumber  */
  N_GetPos(typenumber, type, inx);

  aset_switch(type, inx);

doufn:
  ERROR_EXIT(inx);

}